

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_blow(parser *p)

{
  long *plVar1;
  _Bool _Var2;
  void *pvVar3;
  char *pcVar4;
  blow_method *pbVar5;
  blow_effect *pbVar6;
  parser_error pVar7;
  long *plVar8;
  random_conflict rVar9;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar7 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar3 + 0x78);
    if (*(long **)((long)pvVar3 + 0x78) == (long *)0x0) {
      plVar8 = (long *)((long)pvVar3 + 0x78);
    }
    else {
      do {
        plVar8 = plVar1;
        plVar1 = (long *)*plVar8;
      } while ((long *)*plVar8 != (long *)0x0);
    }
    pvVar3 = mem_zalloc(0x30);
    *plVar8 = (long)pvVar3;
    pcVar4 = parser_getsym(p,"method");
    pbVar5 = findmeth(pcVar4);
    *(blow_method **)((long)pvVar3 + 8) = pbVar5;
    if (pbVar5 == (blow_method *)0x0) {
      pVar7 = PARSE_ERROR_UNRECOGNISED_BLOW;
    }
    else {
      _Var2 = parser_hasval(p,"effect");
      if (_Var2) {
        pcVar4 = parser_getsym(p,"effect");
        pbVar6 = findeff(pcVar4);
        *(blow_effect **)((long)pvVar3 + 0x10) = pbVar6;
        if (pbVar6 == (blow_effect *)0x0) {
          return PARSE_ERROR_INVALID_EFFECT;
        }
      }
      else {
        pbVar6 = findeff("NONE");
        *(blow_effect **)((long)pvVar3 + 0x10) = pbVar6;
      }
      _Var2 = parser_hasval(p,"damage");
      pVar7 = PARSE_ERROR_NONE;
      if (_Var2) {
        rVar9 = parser_getrand(p,"damage");
        *(random_conflict *)((long)pvVar3 + 0x18) = rVar9;
      }
    }
  }
  return pVar7;
}

Assistant:

static enum parser_error parse_monster_blow(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_blow *b = r->blow;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	/* Go to the last valid blow, then allocate a new one */
	if (!b) {
		r->blow = mem_zalloc(sizeof(struct monster_blow));
		b = r->blow;
	} else {
		while (b->next)
			b = b->next;
		b->next = mem_zalloc(sizeof(struct monster_blow));
		b = b->next;
	}

	/* Now read the data */
	b->method = findmeth(parser_getsym(p, "method"));
	if (!b->method)
		return PARSE_ERROR_UNRECOGNISED_BLOW;
	if (parser_hasval(p, "effect")) {
		b->effect = findeff(parser_getsym(p, "effect"));
		if (!b->effect)
			return PARSE_ERROR_INVALID_EFFECT;
	} else {
		b->effect = findeff("NONE");
	}
	if (parser_hasval(p, "damage"))
		b->dice = parser_getrand(p, "damage");

	return PARSE_ERROR_NONE;
}